

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoint_comps(dxt1_endpoint_optimizer *this)

{
  uint uVar1;
  dxt1_endpoint_optimizer *pdVar2;
  byte bVar3;
  bool bVar4;
  uint16 uVar5;
  ushort uVar6;
  ushort uVar7;
  ulong uVar8;
  uint64 uVar9;
  long lVar10;
  sbyte sVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  color_quad_u8 high;
  color_quad_u8 low;
  dxt1_solution_coordinates local_2084;
  dxt1_endpoint_optimizer *local_2080;
  undefined4 local_2074;
  color_quad_u8 source_high;
  color_quad_u8 source_low;
  uint64 best_remaining_error [4];
  uint64 error [4] [256];
  
  compute_selectors(this);
  if (((this->m_best_solution).m_alpha_block == false) && ((this->m_best_solution).m_error != 0)) {
    dxt1_block::unpack_color
              ((dxt1_block *)&source_low,(this->m_best_solution).m_coords.m_low_color,true,0xff);
    dxt1_block::unpack_color
              ((dxt1_block *)&source_high,(this->m_best_solution).m_coords.m_high_color,true,0xff);
    local_2080 = this;
    for (lVar15 = 0; pdVar2 = local_2080, lVar15 != 3; lVar15 = lVar15 + 1) {
      bVar12 = source_low.field_0.c[lVar15];
      bVar3 = source_high.field_0.c[lVar15];
      dxt1_block::unpack_color
                ((dxt1_block *)&low,(local_2080->m_best_solution).m_coords.m_low_color,false,0xff);
      dxt1_block::unpack_color
                ((dxt1_block *)&high,(pdVar2->m_best_solution).m_coords.m_high_color,false,0xff);
      compute_endpoint_component_errors(pdVar2,(uint)lVar15,&error,&best_remaining_error);
      uVar16 = error[1][high.field_0.c[lVar15]] + error[0][low.field_0.c[lVar15]] +
               error[2][(ushort)(((uint)bVar3 + (uint)bVar12 * 2) / 3)] +
               error[3][(ushort)(((uint)bVar12 + (uint)bVar3 * 2) / 3)];
      if (best_remaining_error[0] < uVar16) {
        bVar17 = lVar15 == 1;
        bVar12 = bVar17 * ' ' + 0x20;
        sVar11 = bVar17 * '\x02' + 2;
        uVar8 = 0;
        while (bVar3 = (byte)uVar8, bVar3 < bVar12) {
          uVar9 = error[0][uVar8 & 0xff];
          local_2074 = (int)uVar8;
          if (best_remaining_error[1] + uVar9 < uVar16) {
            low.field_0.c[lVar15] = bVar3;
            uVar5 = dxt1_block::pack_color(&low,false,0x7f);
            bVar3 = bVar3 >> sVar11 | bVar3 << (bVar17 ^ 3U);
            for (lVar14 = 0; bVar13 = (byte)lVar14, bVar13 < bVar12; lVar14 = lVar14 + 1) {
              lVar10 = error[1][lVar14] + uVar9;
              if (best_remaining_error[2] + lVar10 < uVar16) {
                uVar1 = (uint)(byte)(bVar13 >> sVar11 | bVar13 << (bVar17 ^ 3U));
                uVar6 = (ushort)(((uint)bVar3 * 2 + uVar1) / 3);
                lVar10 = lVar10 + error[2][uVar6];
                if ((best_remaining_error[3] + lVar10 < uVar16) &&
                   (uVar7 = (ushort)(((uint)bVar3 + uVar1 * 2) / 3),
                   lVar10 + error[3][uVar7] < uVar16)) {
                  high.field_0.c[lVar15] = bVar13;
                  local_2084.m_high_color = dxt1_block::pack_color(&high,false,0x7f);
                  local_2084.m_low_color = uVar5;
                  bVar4 = evaluate_solution(local_2080,&local_2084,false);
                  pdVar2 = local_2080;
                  if (bVar4) {
                    if ((local_2080->m_best_solution).m_error == 0) {
                      return;
                    }
                    compute_selectors(local_2080);
                    compute_endpoint_component_errors
                              (pdVar2,(uint)lVar15,&error,&best_remaining_error);
                    uVar9 = error[0][uVar8 & 0xff];
                    uVar16 = error[1][lVar14] + uVar9 + error[2][uVar6] + error[3][uVar7];
                    if (uVar16 <= best_remaining_error[1] + uVar9) break;
                  }
                }
              }
            }
          }
          uVar8 = (ulong)CONCAT31((int3)((uint)local_2074 >> 8),(char)local_2074 + '\x01');
        }
      }
    }
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoint_comps()
    {
        compute_selectors();
        if (m_best_solution.m_alpha_block || !m_best_solution.m_error)
        {
            return;
        }
        color_quad_u8 source_low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true));
        color_quad_u8 source_high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true));
        uint64 error[4][256], best_remaining_error[4];
        for (uint comp_index = 0; comp_index < 3; comp_index++)
        {
            uint8 p0 = source_low[comp_index];
            uint8 p1 = source_high[comp_index];
            color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
            color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
            compute_endpoint_component_errors(comp_index, error, best_remaining_error);
            uint64 best_error = error[0][low[comp_index]] + error[1][high[comp_index]] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
            if (best_remaining_error[0] >= best_error)
            {
                continue;
            }
            const uint comp_limit = comp_index == 1 ? 64 : 32;
            for (uint8 c0 = 0; c0 < comp_limit; c0++)
            {
                uint64 e0 = error[0][c0];
                if (e0 + best_remaining_error[1] >= best_error)
                {
                    continue;
                }
                low[comp_index] = c0;
                uint16 packed_low = dxt1_block::pack_color(low, false);
                p0 = comp_index == 1 ? c0 << 2 | c0 >> 4 : c0 << 3 | c0 >> 2;
                for (uint8 c1 = 0; c1 < comp_limit; c1++)
                {
                    uint64 e = e0 + error[1][c1];
                    if (e + best_remaining_error[2] >= best_error)
                    {
                        continue;
                    }
                    p1 = comp_index == 1 ? c1 << 2 | c1 >> 4 : c1 << 3 | c1 >> 2;
                    e += error[2][(p0 * 2 + p1) / 3];
                    if (e + best_remaining_error[3] >= best_error)
                    {
                        continue;
                    }
                    e += error[3][(p0 + p1 * 2) / 3];
                    if (e >= best_error)
                    {
                        continue;
                    }
                    high[comp_index] = c1;
                    if (!evaluate_solution(dxt1_solution_coordinates(packed_low, dxt1_block::pack_color(high, false))))
                    {
                        continue;
                    }
                    if (!m_best_solution.m_error)
                    {
                        return;
                    }
                    compute_selectors();
                    compute_endpoint_component_errors(comp_index, error, best_remaining_error);
                    best_error = error[0][c0] + error[1][c1] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
                    e0 = error[0][c0];
                    if (e0 + best_remaining_error[1] >= best_error)
                    {
                        break;
                    }
                }
            }
        }
    }